

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::limits32<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  optional<unsigned_int> this;
  bool bVar1;
  Lexer *this_00;
  uint *puVar2;
  optional<unsigned_long> oVar3;
  _Optional_payload_base<unsigned_int> local_90;
  _Storage<unsigned_long,_true> local_88;
  optional<unsigned_long> m;
  allocator<char> local_61;
  string local_60;
  Err local_40;
  _Optional_payload_base<unsigned_int> local_20;
  optional<unsigned_int> n;
  ParseDefsCtx *ctx_local;
  
  n.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)ctx;
  local_20 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_20);
  if (bVar1) {
    local_90 = (_Optional_payload_base<unsigned_int>)
               Lexer::takeU32((Lexer *)((long)n.super__Optional_base<unsigned_int,_true,_true>.
                                              _M_payload.super__Optional_payload_base<unsigned_int>
                                       + 8));
    std::optional<unsigned_long>::optional<unsigned_int,_true>
              ((optional<unsigned_long> *)&local_88,(optional<unsigned_int> *)&local_90);
    this = n;
    puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
    oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         (bool)m.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
    oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_88._M_value;
    oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    TypeParserCtx<wasm::WATParser::ParseDefsCtx>::makeLimits
              (__return_storage_ptr__,
               (TypeParserCtx<wasm::WATParser::ParseDefsCtx> *)
               this.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,(ulong)*puVar2,oVar3);
  }
  else {
    this_00 = (Lexer *)((long)n.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_int> + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"expected initial size",&local_61);
    Lexer::err(&local_40,this_00,&local_60);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits32(Ctx& ctx) {
  auto n = ctx.in.takeU32();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU32();
  return ctx.makeLimits(uint64_t(*n), m);
}